

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O0

void * __thiscall sc_core::sc_plist_base::front(sc_plist_base *this)

{
  long *in_RDI;
  int in_stack_00000064;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  undefined8 local_8;
  
  if (*in_RDI == 0) {
    sc_report_handler::report
              (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000064);
    local_8 = (void *)0x0;
  }
  else {
    local_8 = *(void **)*in_RDI;
  }
  return local_8;
}

Assistant:

void*
sc_plist_base::front() const
{

   if (head) {			
        return head->data;
    }				
    else {
      SC_REPORT_ERROR( SC_ID_FRONT_ON_EMPTY_LIST_ , 0 );
      // never reached
      return 0;
    }
}